

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::GetProperty(Prim *prim,string *attr_name,Property *out_prop,string *err)

{
  TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *pTVar1;
  vtable_type *pvVar2;
  pointer pXVar3;
  pointer pSVar4;
  uint32_t uVar5;
  int iVar6;
  Model *pMVar7;
  const_iterator cVar8;
  GeomSubset *pGVar9;
  Scope *pSVar10;
  GeomMesh *pGVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Shader *shader;
  Material *material;
  undefined8 uVar13;
  ostream *poVar14;
  SkelRoot *skelroot;
  pointer pPVar15;
  BlendShape *blendshape;
  Skeleton *skel;
  SkelAnimation *anim;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *pvVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *__function;
  ElementType extraout_EDX;
  ElementType extraout_EDX_00;
  ElementType extraout_EDX_01;
  ElementType v;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *extraout_RDX_01;
  OpType *op;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *err_00;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *extraout_RDX_06;
  string *extraout_RDX_07;
  string *extraout_RDX_08;
  string *err_01;
  string *err_02;
  string *psVar17;
  undefined1 uVar18;
  long lVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long lVar20;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *input;
  AttrMetas *pAVar21;
  ulong uVar22;
  TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *input_00;
  pointer this;
  bool bVar23;
  string op_name;
  PrimVar pv;
  Value val;
  Value val_1;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  ostringstream ss_e;
  storage_union local_988;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_978;
  GeomSubset *local_960;
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [24];
  bool local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  string *local_8f8;
  Prim *local_8f0;
  string *local_8e8;
  GeomMesh *local_8e0;
  storage_union local_8d8;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [32];
  Variability local_898;
  bool local_894;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  undefined1 auStack_818 [88];
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_7c0;
  undefined1 local_790;
  undefined8 local_788;
  undefined1 local_780;
  storage_t<tinyusdz::Token> local_778;
  undefined1 local_758;
  storage_t<tinyusdz::Token> local_750;
  undefined1 local_730;
  storage_t<tinyusdz::Token> local_728;
  undefined1 local_708;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_700;
  undefined1 local_6d0;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6c8;
  undefined1 local_6a8;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a0;
  undefined1 local_680;
  storage_t<tinyusdz::Token> local_678;
  _Rb_tree_node_base local_650 [2];
  undefined1 local_610 [8];
  undefined1 local_608 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [8];
  undefined1 auStack_5e8 [32];
  any local_5c8;
  undefined1 local_5b0;
  undefined1 local_5a8 [32];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_588;
  AttrMetas AStack_570;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 local_360;
  Path PStack_358;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_288;
  undefined4 local_270;
  AttrMetas AStack_268;
  undefined1 local_60;
  string asStack_58 [40];
  
  pvVar2 = (prim->_data).v_.vtable;
  if ((pvVar2 == (vtable_type *)0x0) || (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x401)) {
    pvVar2 = (prim->_data).v_.vtable;
    if ((pvVar2 == (vtable_type *)0x0) || (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x404)) {
      pvVar2 = (prim->_data).v_.vtable;
      if ((pvVar2 != (vtable_type *)0x0) && (uVar5 = (*pvVar2->type_id)(), uVar5 == 0x402)) {
        pSVar10 = tinyusdz::value::Value::as<tinyusdz::Scope>(&prim->_data,false);
        if (out_prop == (Property *)0x0) {
          local_610 = (undefined1  [8])0x439af1;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_8b8,(unexpected_type<const_char_*> *)local_610);
        }
        else {
          cVar8 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          *)&pSVar10->props,attr_name);
          if ((_Rb_tree_header *)cVar8._M_node ==
              &(pSVar10->props)._M_t._M_impl.super__Rb_tree_header) {
            local_898 = CONCAT31(local_898._1_3_,1);
            local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
          }
          else {
            ::std::__cxx11::string::_M_assign((string *)out_prop);
            (out_prop->_attrib)._varying_authored = (bool)cVar8._M_node[3].field_0x4;
            (out_prop->_attrib)._variability = cVar8._M_node[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
            linb::any::operator=
                      ((any *)&(out_prop->_attrib)._var,(any *)&cVar8._M_node[4]._M_parent);
            (out_prop->_attrib)._var._blocked = SUB41(cVar8._M_node[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(out_prop->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&cVar8._M_node[5]._M_parent);
            (out_prop->_attrib)._var._ts._dirty = SUB41(cVar8._M_node[6]._M_color,0);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(out_prop->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &cVar8._M_node[6]._M_parent);
            AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar8._M_node + 7));
            *(_Base_ptr *)&out_prop->_listOpQual = cVar8._M_node[0x17]._M_parent;
            (out_prop->_rel).type = *(Type *)&cVar8._M_node[0x17]._M_left;
            Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar8._M_node[0x17]._M_right);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(out_prop->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &cVar8._M_node[0x1e]._M_parent);
            (out_prop->_rel).listOpQual = cVar8._M_node[0x1f]._M_color;
            AttrMetas::operator=
                      (&(out_prop->_rel)._metas,(AttrMetas *)&cVar8._M_node[0x1f]._M_parent);
            (out_prop->_rel)._varying_authored = *(bool *)&cVar8._M_node[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
            out_prop->_has_custom = *(bool *)&cVar8._M_node[0x30]._M_right;
            local_898 = CONCAT31(local_898._1_3_,1);
            local_8b8[0] = 1;
          }
        }
        if ((bool)(undefined1)local_898 == true) {
          bVar23 = true;
          if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,"GetProperty",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
          poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x791);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
          local_988.dynamic = &local_978;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
          local_918.field_2._0_4_ = 0x706f6353;
          local_918.field_2._M_local_buf[4] = 'e';
          goto LAB_00346a4c;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
        iVar6 = 0x791;
        goto LAB_00349590;
      }
      pvVar2 = (prim->_data).v_.vtable;
      if ((pvVar2 != (vtable_type *)0x0) && (uVar5 = (*pvVar2->type_id)(), uVar5 == 0x405)) {
        pGVar11 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(&prim->_data,false);
        if (out_prop == (Property *)0x0) {
          local_610 = (undefined1  [8])0x439af1;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_8b8,(unexpected_type<const_char_*> *)local_610);
        }
        else {
          local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
          local_918._M_string_length = 0;
          local_918.field_2._0_4_ = local_918.field_2._0_4_ & 0xffffff00;
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_8b8._8_8_ = (pointer)0x0;
            local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_894 = false;
            local_890._M_allocated_capacity = (size_type)&local_880;
            local_890._8_8_ = 0;
            local_880._M_local_buf[0] = '\0';
            local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_870.dynamic = (void *)0x0;
            local_858 = false;
            local_850._0_8_ = (pointer)0x0;
            local_850[8] = 0;
            local_850._9_7_ = 0;
            local_850[0x10] = 0;
            local_850._17_8_ = 0;
            auStack_818._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            auStack_818[8] = false;
            auStack_818._12_4_ = (storage_t<unsigned_int>)0x0;
            auStack_818[0x10] = false;
            auStack_818[0x11] = (storage_t<bool>)0x0;
            auStack_818[0x18] = false;
            local_788 = (storage_t<double>)0x0;
            local_780 = false;
            local_678._16_8_ = 0;
            local_678._24_8_ = 0;
            local_678.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_678._8_8_ = 0;
            local_650[0]._M_left = local_650;
            local_650[0]._M_color = _S_red;
            local_650[0]._M_parent = (_Base_ptr)0x0;
            auStack_818._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_818._40_8_ = 0;
            auStack_818._48_8_ = 0;
            auStack_818._56_8_ = 0;
            auStack_818._64_8_ = 0;
            auStack_818._72_8_ = 0;
            auStack_818[0x50] = false;
            local_7c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_7c0._8_8_ = 0;
            local_7c0._16_8_ = 0;
            local_7c0._24_8_ = 0;
            local_7c0._32_8_ = 0;
            local_7c0._40_8_ = 0;
            local_790 = false;
            local_778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_778._8_8_ = 0;
            local_778._16_8_ = 0;
            local_778._24_8_ = 0;
            local_758 = false;
            local_750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_750._8_8_ = 0;
            local_750._16_8_ = 0;
            local_750._24_8_ = 0;
            local_730 = false;
            local_708 = false;
            local_728._16_8_ = 0;
            local_728._24_8_ = 0;
            local_728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_728._8_8_ = 0;
            local_6d0 = false;
            local_700._32_8_ = 0;
            local_700._40_8_ = 0;
            local_700._16_8_ = 0;
            local_700._24_8_ = 0;
            local_700.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_700._8_8_ = 0;
            local_6a8 = false;
            local_6c8._16_8_ = 0;
            local_6c8._24_8_ = 0;
            local_6c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_6c8._8_8_ = 0;
            local_680 = false;
            local_6a0._16_8_ = 0;
            local_6a0._24_8_ = 0;
            local_6a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_6a0._8_8_ = 0;
            local_830[0x10] = 0;
            stack0xfffffffffffff7e1 = 0;
            local_830._0_8_ = (pointer)0x0;
            local_830[8] = 0;
            local_830._9_7_ = 0;
            local_650[1]._0_8_ = 0;
            local_650[1]._M_parent = (_Base_ptr)0x0;
            local_650[1]._M_left = (_Base_ptr)0x0;
            local_650[1]._M_right = (_Base_ptr)0x0;
            local_898 = Varying;
            local_8f0 = prim;
            local_8e0 = pGVar11;
            local_650[0]._M_right = local_650[0]._M_left;
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            ::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign((string *)local_890._M_local_buf);
            if (local_610 != (undefined1  [8])&local_600) {
              operator_delete((void *)local_610,local_600._M_allocated_capacity + 1);
            }
            pGVar11 = local_8e0;
            if ((local_8e0->points)._blocked == true) {
              local_858 = true;
            }
            if ((local_8e0->points)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (local_8e0->points)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                         &(local_8e0->points)._paths);
            }
            local_948._0_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_958._0_8_ = (pointer)0x0;
            local_948[8] = false;
            local_938._0_8_ = (pointer)0x0;
            local_938[8] = 0;
            local_938._9_7_ = 0;
            local_938[0x10] = 0;
            stack0xfffffffffffff6d9 = 0;
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
            ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        *)local_610,&(pGVar11->points)._attrib);
            local_8f8 = attr_name;
            local_8e8 = err;
            if (local_610[0] == '\x01') {
              if (local_5f0[1] == 1) {
                local_858 = true;
              }
              if (local_5f0[0] == Uniform) {
                local_988.dynamic =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_988._8_1_ = 0;
                local_988._9_7_ = 0;
                local_978._M_local_buf[0] = '\0';
                local_978._M_allocated_capacity._1_7_ = 0;
                if (local_5f0[1] == Varying >> 8) {
                  ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                  ::operator=((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                               *)&local_988,
                              (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                               *)local_608);
                  local_8c8._0_8_ =
                       linb::any::
                       vtable_for_type<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>()
                       ::table;
                  pvVar16 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)operator_new(0x18);
                  ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                  ::vector((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                            *)pvVar16,
                           (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                            *)&local_988);
                  local_8d8.dynamic = pvVar16;
                  linb::any::operator=((any *)local_958,(any *)&local_8d8);
                  pGVar11 = local_8e0;
                  if ((pointer)local_8c8._0_8_ != (pointer)0x0) {
                    (**(code **)&((pointer)(local_8c8._0_8_ + 0x18))->z)(&local_8d8);
                    local_8c8._0_8_ = (pointer)0x0;
                    pGVar11 = local_8e0;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_988.dynamic !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_988.dynamic,
                                  CONCAT71(local_978._M_allocated_capacity._1_7_,
                                           local_978._M_local_buf[0]) - local_988._0_8_);
                }
              }
              if (local_610[0] != '\0') {
                if (auStack_5e8[0x18] == '\x01') {
                  TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                  ::update((TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                            *)auStack_5e8);
                }
                if (CONCAT71(auStack_5e8._9_7_,auStack_5e8[8]) !=
                    CONCAT71(auStack_5e8._1_7_,auStack_5e8[0])) {
                  if (local_610[0] == '\0') goto LAB_00349982;
                  if (auStack_5e8[0x18] == '\x01') {
                    TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                    ::update((TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                              *)auStack_5e8);
                  }
                  local_978._M_local_buf[0] = '\0';
                  local_978._M_allocated_capacity._1_7_ = 0;
                  local_978._M_local_buf[8] = '\0';
                  local_988.dynamic =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_988._8_1_ = 0;
                  local_988._9_7_ = 0;
                  lVar19 = CONCAT71(auStack_5e8._1_7_,auStack_5e8[0]);
                  if (CONCAT71(auStack_5e8._9_7_,auStack_5e8[8]) != lVar19) {
                    lVar20 = 8;
                    uVar22 = 0;
                    do {
                      local_960 = *(GeomSubset **)(lVar19 + -8 + lVar20);
                      local_8c8._0_8_ =
                           linb::any::
                           vtable_for_type<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>()
                           ::table;
                      pvVar16 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                 *)operator_new(0x18);
                      ::std::
                      vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
                      vector((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              *)pvVar16,
                             (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              *)(lVar19 + lVar20));
                      local_8d8.dynamic = pvVar16;
                      tinyusdz::value::TimeSamples::add_sample
                                ((TimeSamples *)&local_988,(double)local_960,(Value *)&local_8d8);
                      if ((pointer)local_8c8._0_8_ != (pointer)0x0) {
                        (**(code **)&((pointer)(local_8c8._0_8_ + 0x18))->z)(&local_8d8);
                        local_8c8._0_8_ = (pointer)0x0;
                      }
                      uVar22 = uVar22 + 1;
                      lVar19 = CONCAT71(auStack_5e8._1_7_,auStack_5e8[0]);
                      lVar20 = lVar20 + 0x28;
                    } while (uVar22 < (ulong)((CONCAT71(auStack_5e8._9_7_,auStack_5e8[8]) - lVar19
                                              >> 3) * -0x3333333333333333));
                  }
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)local_938,
                              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&local_988);
                  local_920 = (bool)local_978._M_local_buf[8];
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&local_988);
                  pGVar11 = local_8e0;
                }
                if (local_610[0] != '\0') {
                  if (local_5f0[0] == Varying) {
                    if (auStack_5e8[0x18] == '\x01') {
                      TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                      ::update((TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                                *)auStack_5e8);
                    }
                    if (CONCAT71(auStack_5e8._9_7_,auStack_5e8[8]) ==
                        CONCAT71(auStack_5e8._1_7_,auStack_5e8[0])) goto LAB_00347acd;
                  }
                  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_958);
                  goto LAB_00347acd;
                }
              }
LAB_00349982:
              __function = 
              "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f>>>::value() [T = tinyusdz::Animatable<std::vector<tinyusdz::value::point3f>>]"
              ;
LAB_00349997:
              __assert_fail("has_value()",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                            ,0x591,__function);
            }
LAB_00347acd:
            if (local_610[0] == '\x01') {
              nonstd::optional_lite::detail::
              storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                *)local_608);
            }
            pAVar21 = &(pGVar11->points)._metas;
LAB_00347aeb:
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_938);
            if ((pointer)local_948._0_8_ != (pointer)0x0) {
              (*(code *)(((string *)(local_948._0_8_ + 0x20))->_M_dataplus)._M_p)(local_958);
              local_948._0_8_ = (pointer)0x0;
            }
            local_960 = (GeomSubset *)(local_830 + 0x18);
            AttrMetas::operator=((AttrMetas *)local_960,pAVar21);
            Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
            ::std::__cxx11::string::operator=((string *)out_prop,(string *)local_610);
            (out_prop->_attrib)._variability = local_5f0._0_4_;
            (out_prop->_attrib)._varying_authored = (bool)local_5f0[4];
            ::std::__cxx11::string::operator=
                      ((string *)&(out_prop->_attrib)._type_name,(string *)auStack_5e8);
            linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
            (out_prop->_attrib)._var._blocked = (bool)local_5b0;
            local_958._0_8_ =
                 (out_prop->_attrib)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_958._8_8_ =
                 (out_prop->_attrib)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_948._0_8_ =
                 (out_prop->_attrib)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (out_prop->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5a8._0_8_;
            (out_prop->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5a8._8_8_;
            (out_prop->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5a8._16_8_;
            local_5a8._0_8_ = (pointer)0x0;
            local_5a8._8_8_ = (pointer)0x0;
            local_5a8._16_8_ = (pointer)0x0;
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_958);
            (out_prop->_attrib)._var._ts._dirty = (bool)local_5a8[0x18];
            local_958._0_8_ =
                 (out_prop->_attrib)._paths.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_958._8_8_ =
                 (out_prop->_attrib)._paths.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_948._0_8_ =
                 (out_prop->_attrib)._paths.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            (out_prop->_attrib)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (out_prop->_attrib)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (out_prop->_attrib)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_958);
            AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
            out_prop->_listOpQual = local_368;
            out_prop->_type = uStack_364;
            (out_prop->_rel).type = local_360;
            Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
            local_958._0_8_ =
                 (out_prop->_rel).targetPathVector.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_958._8_8_ =
                 (out_prop->_rel).targetPathVector.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_948._0_8_ =
                 (out_prop->_rel).targetPathVector.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            (out_prop->_rel).targetPathVector.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (out_prop->_rel).targetPathVector.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (out_prop->_rel).targetPathVector.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_958);
            (out_prop->_rel).listOpQual = local_270;
            AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
            (out_prop->_rel)._varying_authored = (bool)local_60;
            ::std::__cxx11::string::operator=((string *)&out_prop->_prop_value_type_name,asStack_58)
            ;
            out_prop->_has_custom = (bool)asStack_58[0x20];
            Property::~Property((Property *)local_610);
            AttrMetas::~AttrMetas((AttrMetas *)local_960);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_850);
            if (local_860 != (vtable_type *)0x0) {
              (*local_860->destroy)(&local_870);
              local_860 = (vtable_type *)0x0;
            }
            err = local_8e8;
            prim = local_8f0;
            attr_name = local_8f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_890._M_allocated_capacity != &local_880) {
              operator_delete((void *)local_890._M_allocated_capacity,
                              CONCAT71(local_880._M_allocated_capacity._1_7_,
                                       local_880._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
              operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
            }
            goto LAB_00347e2e;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          psVar17 = extraout_RDX_02;
          if ((iVar6 == 0) ||
             (iVar6 = ::std::__cxx11::string::compare((char *)attr_name), psVar17 = extraout_RDX_03,
             iVar6 == 0)) {
            input = &pGVar11->faceVertexCounts;
            goto LAB_003475a1;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_8b8._8_8_ = (pointer)0x0;
            local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_894 = false;
            local_890._M_allocated_capacity = (size_type)&local_880;
            local_890._8_8_ = 0;
            local_880._M_local_buf[0] = '\0';
            local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_870.dynamic = (void *)0x0;
            local_858 = false;
            local_850._0_8_ = (pointer)0x0;
            local_850[8] = 0;
            local_850._9_7_ = 0;
            local_850[0x10] = 0;
            local_850._17_8_ = 0;
            auStack_818._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            auStack_818[8] = false;
            auStack_818._12_4_ = (storage_t<unsigned_int>)0x0;
            auStack_818[0x10] = false;
            auStack_818[0x11] = (storage_t<bool>)0x0;
            auStack_818[0x18] = false;
            local_788 = (storage_t<double>)0x0;
            local_780 = false;
            local_678._16_8_ = 0;
            local_678._24_8_ = 0;
            local_678.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_678._8_8_ = 0;
            local_650[0]._M_left = local_650;
            local_650[0]._M_color = _S_red;
            local_650[0]._M_parent = (_Base_ptr)0x0;
            auStack_818._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_818._40_8_ = 0;
            auStack_818._48_8_ = 0;
            auStack_818._56_8_ = 0;
            auStack_818._64_8_ = 0;
            auStack_818._72_8_ = 0;
            auStack_818[0x50] = false;
            local_7c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_7c0._8_8_ = 0;
            local_7c0._16_8_ = 0;
            local_7c0._24_8_ = 0;
            local_7c0._32_8_ = 0;
            local_7c0._40_8_ = 0;
            local_790 = false;
            local_778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_778._8_8_ = 0;
            local_778._16_8_ = 0;
            local_778._24_8_ = 0;
            local_758 = false;
            local_750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_750._8_8_ = 0;
            local_750._16_8_ = 0;
            local_750._24_8_ = 0;
            local_730 = false;
            local_708 = false;
            local_728._16_8_ = 0;
            local_728._24_8_ = 0;
            local_728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_728._8_8_ = 0;
            local_6d0 = false;
            local_700._32_8_ = 0;
            local_700._40_8_ = 0;
            local_700._16_8_ = 0;
            local_700._24_8_ = 0;
            local_700.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_700._8_8_ = 0;
            local_6a8 = false;
            local_6c8._16_8_ = 0;
            local_6c8._24_8_ = 0;
            local_6c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_6c8._8_8_ = 0;
            local_680 = false;
            local_6a0._16_8_ = 0;
            local_6a0._24_8_ = 0;
            local_6a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_6a0._8_8_ = 0;
            local_830[0x10] = 0;
            stack0xfffffffffffff7e1 = 0;
            local_830._0_8_ = (pointer)0x0;
            local_830[8] = 0;
            local_830._9_7_ = 0;
            local_650[1]._0_8_ = 0;
            local_650[1]._M_parent = (_Base_ptr)0x0;
            local_650[1]._M_left = (_Base_ptr)0x0;
            local_650[1]._M_right = (_Base_ptr)0x0;
            local_898 = Varying;
            local_8f0 = prim;
            local_8e0 = pGVar11;
            local_650[0]._M_right = local_650[0]._M_left;
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            ::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign((string *)local_890._M_local_buf);
            if (local_610 != (undefined1  [8])&local_600) {
              operator_delete((void *)local_610,local_600._M_allocated_capacity + 1);
            }
            pGVar11 = local_8e0;
            if ((local_8e0->normals)._blocked == true) {
              local_858 = true;
            }
            if ((local_8e0->normals)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (local_8e0->normals)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                         &(local_8e0->normals)._paths);
            }
            local_948._0_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_958._0_8_ = (pointer)0x0;
            local_948[8] = false;
            local_938._0_8_ = (pointer)0x0;
            local_938[8] = 0;
            local_938._9_7_ = 0;
            local_938[0x10] = 0;
            stack0xfffffffffffff6d9 = 0;
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
            ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                        *)local_610,&(pGVar11->normals)._attrib);
            local_8f8 = attr_name;
            local_8e8 = err;
            if (local_610[0] == '\x01') {
              if (local_5f0[1] == 1) {
                local_858 = true;
              }
              if (local_5f0[0] == Uniform) {
                local_988.dynamic =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_988._8_1_ = 0;
                local_988._9_7_ = 0;
                local_978._M_local_buf[0] = '\0';
                local_978._M_allocated_capacity._1_7_ = 0;
                if (local_5f0[1] == Varying >> 8) {
                  ::std::
                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
                  operator=((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)&local_988,
                            (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)local_608);
                  local_8c8._0_8_ =
                       linb::any::
                       vtable_for_type<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>()
                       ::table;
                  pvVar16 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)operator_new(0x18);
                  ::std::
                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
                  vector(pvVar16,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                  *)&local_988);
                  local_8d8.dynamic = pvVar16;
                  linb::any::operator=((any *)local_958,(any *)&local_8d8);
                  pGVar11 = local_8e0;
                  if ((pointer)local_8c8._0_8_ != (pointer)0x0) {
                    (**(code **)&((pointer)(local_8c8._0_8_ + 0x18))->z)(&local_8d8);
                    local_8c8._0_8_ = (pointer)0x0;
                    pGVar11 = local_8e0;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_988.dynamic !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_988.dynamic,
                                  CONCAT71(local_978._M_allocated_capacity._1_7_,
                                           local_978._M_local_buf[0]) - local_988._0_8_);
                }
              }
              if (local_610[0] != '\0') {
                if (auStack_5e8[0x18] == '\x01') {
                  TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                  ::update((TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                            *)auStack_5e8);
                }
                if (CONCAT71(auStack_5e8._9_7_,auStack_5e8[8]) !=
                    CONCAT71(auStack_5e8._1_7_,auStack_5e8[0])) {
                  if (local_610[0] == '\0') goto LAB_003499a1;
                  if (auStack_5e8[0x18] == '\x01') {
                    TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                    ::update((TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                              *)auStack_5e8);
                  }
                  local_978._M_local_buf[0] = '\0';
                  local_978._M_allocated_capacity._1_7_ = 0;
                  local_978._M_local_buf[8] = '\0';
                  local_988.dynamic =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_988._8_1_ = 0;
                  local_988._9_7_ = 0;
                  lVar19 = CONCAT71(auStack_5e8._1_7_,auStack_5e8[0]);
                  if (CONCAT71(auStack_5e8._9_7_,auStack_5e8[8]) != lVar19) {
                    lVar20 = 8;
                    uVar22 = 0;
                    do {
                      local_960 = *(GeomSubset **)(lVar19 + -8 + lVar20);
                      local_8c8._0_8_ =
                           linb::any::
                           vtable_for_type<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>()
                           ::table;
                      pvVar16 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                 *)operator_new(0x18);
                      ::std::
                      vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ::vector(pvVar16,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)(lVar19 + lVar20));
                      local_8d8.dynamic = pvVar16;
                      tinyusdz::value::TimeSamples::add_sample
                                ((TimeSamples *)&local_988,(double)local_960,(Value *)&local_8d8);
                      if ((pointer)local_8c8._0_8_ != (pointer)0x0) {
                        (**(code **)&((pointer)(local_8c8._0_8_ + 0x18))->z)(&local_8d8);
                        local_8c8._0_8_ = (pointer)0x0;
                      }
                      uVar22 = uVar22 + 1;
                      lVar19 = CONCAT71(auStack_5e8._1_7_,auStack_5e8[0]);
                      lVar20 = lVar20 + 0x28;
                    } while (uVar22 < (ulong)((CONCAT71(auStack_5e8._9_7_,auStack_5e8[8]) - lVar19
                                              >> 3) * -0x3333333333333333));
                  }
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)local_938,
                              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&local_988);
                  local_920 = (bool)local_978._M_local_buf[8];
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&local_988);
                  pGVar11 = local_8e0;
                }
                if (local_610[0] != '\0') {
                  if (local_5f0[0] == Varying) {
                    if (auStack_5e8[0x18] == '\x01') {
                      TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                      ::update((TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                                *)auStack_5e8);
                    }
                    if (CONCAT71(auStack_5e8._9_7_,auStack_5e8[8]) ==
                        CONCAT71(auStack_5e8._1_7_,auStack_5e8[0])) goto LAB_003488f2;
                  }
                  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_958);
                  goto LAB_003488f2;
                }
              }
LAB_003499a1:
              __function = 
              "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>>::value() [T = tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>]"
              ;
              goto LAB_00349997;
            }
LAB_003488f2:
            if (local_610[0] == '\x01') {
              nonstd::optional_lite::detail::
              storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                *)local_608);
            }
            pAVar21 = &(pGVar11->normals)._metas;
            goto LAB_00347aeb;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      (&pGVar11->velocities,out_prop,err_00);
            goto LAB_00347e2e;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            input = &pGVar11->cornerIndices;
            psVar17 = extraout_RDX_04;
LAB_003475a1:
            (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                      (input,out_prop,psVar17);
LAB_00347e2e:
            local_898 = CONCAT31(local_898._1_3_,1);
            local_8b8[0] = 1;
          }
          else {
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              input_00 = &pGVar11->cornerSharpnesses;
              psVar17 = extraout_RDX_05;
LAB_003496bd:
              (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                        (input_00,out_prop,psVar17);
              goto LAB_00347e2e;
            }
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              input = &pGVar11->creaseIndices;
              psVar17 = extraout_RDX_06;
              goto LAB_003475a1;
            }
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              input_00 = &pGVar11->creaseSharpnesses;
              psVar17 = extraout_RDX_07;
              goto LAB_003496bd;
            }
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              input = &pGVar11->holeIndices;
              psVar17 = extraout_RDX_08;
              goto LAB_003475a1;
            }
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              bVar23 = anon_unknown_6::ToTokenProperty<tinyusdz::GeomMesh::InterpolateBoundary>
                                 (&pGVar11->interpolateBoundary,out_prop,&local_918);
              if (bVar23) goto LAB_00347e2e;
              local_988.dynamic = &local_978;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,"Convert Property {} failed: {}\n","");
              fmt::format<char[20],std::__cxx11::string>
                        ((string *)local_958,(fmt *)&local_988,(string *)"interpolateBoundary",
                         (char (*) [20])&local_918,in_R8);
LAB_003497fb:
              local_8b8._16_8_ = local_948._0_8_;
              local_8b8._8_8_ = local_958._8_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_958._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_948) {
                local_600._8_8_ = CONCAT71(local_948._9_7_,local_948[8]);
                local_610 = (undefined1  [8])&local_600;
              }
              else {
                local_610 = (undefined1  [8])local_958._0_8_;
              }
              local_958._8_8_ = (pointer)0x0;
              local_948._0_8_ = local_948._0_8_ & 0xffffffffffffff00;
              local_8b8._0_8_ = local_8b8 + 0x10;
              local_898 = local_898 & 0xffffff00;
              if (local_610 == (undefined1  [8])&local_600) {
                local_8b8._24_8_ = local_600._8_8_;
              }
              else {
                local_8b8._0_8_ = local_610;
              }
              local_608 = (undefined1  [8])0x0;
              local_600._M_allocated_capacity = local_8b8._16_8_ & 0xffffffffffffff00;
              local_958._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_948;
              local_610 = (undefined1  [8])&local_600;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_988.dynamic != &local_978) {
                operator_delete(local_988.dynamic,
                                CONCAT71(local_978._M_allocated_capacity._1_7_,
                                         local_978._M_local_buf[0]) + 1);
              }
            }
            else {
              iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
              if (iVar6 == 0) {
                bVar23 = anon_unknown_6::ToTokenProperty<tinyusdz::GeomMesh::SubdivisionScheme>
                                   (&pGVar11->subdivisionScheme,out_prop,err_01);
                if (bVar23) goto LAB_00347e2e;
                local_988.dynamic = &local_978;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_988,"Convert Property {} failed: {}\n","");
                fmt::format<char[18],std::__cxx11::string>
                          ((string *)local_958,(fmt *)&local_988,(string *)"subdivisionScheme",
                           (char (*) [18])&local_918,in_R8);
                goto LAB_003497fb;
              }
              iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
              if (iVar6 == 0) {
                bVar23 = anon_unknown_6::
                         ToTokenProperty<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                   (&pGVar11->faceVaryingLinearInterpolation,out_prop,&local_918);
                if (bVar23) goto LAB_00347e2e;
                local_988.dynamic = &local_978;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_988,"Convert Property {} failed: {}\n","");
                fmt::format<char[31],std::__cxx11::string>
                          ((string *)local_958,(fmt *)&local_988,
                           (string *)"faceVaryingLinearInterpolation",(char (*) [31])&local_918,
                           in_R8);
                goto LAB_003497fb;
              }
              iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
              if (iVar6 == 0) {
                if ((pGVar11->skeleton).has_value_ == true) {
                  Property::Property((Property *)local_610,
                                     (Relationship *)&(pGVar11->skeleton).contained,false);
                  Property::operator=(out_prop,(Property *)local_610);
                  Property::~Property((Property *)local_610);
                  goto LAB_00347e2e;
                }
                local_898 = CONCAT31(local_898._1_3_,1);
                local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
              }
              else {
                local_8f8 = attr_name;
                cVar8 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                *)&(pGVar11->super_GPrim).props,attr_name);
                if ((_Rb_tree_header *)cVar8._M_node !=
                    &(pGVar11->super_GPrim).props._M_t._M_impl.super__Rb_tree_header) {
                  Property::operator=(out_prop,(Property *)(cVar8._M_node + 2));
                  attr_name = local_8f8;
                  goto LAB_00347e2e;
                }
                local_898 = CONCAT31(local_898._1_3_,1);
                local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
                attr_name = local_8f8;
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_918._M_dataplus._M_p != &local_918.field_2) {
            operator_delete(local_918._M_dataplus._M_p,
                            CONCAT17(local_918.field_2._M_local_buf[7],
                                     CONCAT16(local_918.field_2._M_local_buf[6],
                                              CONCAT15(local_918.field_2._M_local_buf[5],
                                                       CONCAT14(local_918.field_2._M_local_buf[4],
                                                                local_918.field_2._0_4_)))) + 1);
          }
        }
        if ((bool)(undefined1)local_898 == true) {
          bVar23 = true;
          if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,"GetProperty",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
          poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x792);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
          local_988.dynamic = &local_978;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
          args = &(prim->_elementPath)._prim_part;
          local_918.field_2._0_4_ = 0x6873654d;
          local_918._M_string_length = 4;
          local_918.field_2._M_local_buf[4] = '\0';
          goto LAB_003473bd;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
        iVar6 = 0x792;
        goto LAB_00349590;
      }
      pvVar2 = (prim->_data).v_.vtable;
      if ((pvVar2 == (vtable_type *)0x0) || (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x40e)) {
        pvVar2 = (prim->_data).v_.vtable;
        if ((pvVar2 == (vtable_type *)0x0) || (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x801)) {
          pvVar2 = (prim->_data).v_.vtable;
          if ((pvVar2 == (vtable_type *)0x0) || (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x802)) {
            pvVar2 = (prim->_data).v_.vtable;
            if ((pvVar2 == (vtable_type *)0x0) || (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x2001)) {
              pvVar2 = (prim->_data).v_.vtable;
              if ((pvVar2 == (vtable_type *)0x0) || (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x2004))
              {
                pvVar2 = (prim->_data).v_.vtable;
                if ((pvVar2 == (vtable_type *)0x0) ||
                   (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x2002)) {
                  pvVar2 = (prim->_data).v_.vtable;
                  if ((pvVar2 == (vtable_type *)0x0) ||
                     (uVar5 = (*pvVar2->type_id)(), uVar5 != 0x2003)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                               ,0x5c);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"GetProperty",0xb);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"():",3);
                    poVar14 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_610,0x79a);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"TODO: Prim type ",0x10);
                    pvVar2 = (prim->_data).v_.vtable;
                    if (pvVar2 == (vtable_type *)0x0) {
                      local_8b8._0_8_ = local_8b8 + 0x10;
                      local_8b8._8_8_ = (pointer)0x4;
                      local_8b8._16_5_ = 0x64696f76;
                    }
                    else {
                      (*pvVar2->type_name)((string *)local_8b8);
                    }
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_610,(char *)local_8b8._0_8_,
                                         local_8b8._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
                      operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
                    }
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append((char *)err,local_8b8._0_8_);
                      if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
                        operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
                    ::std::ios_base::~ios_base((ios_base *)(local_5a8 + 8));
                    return false;
                  }
                  anim = tinyusdz::value::Value::as<tinyusdz::SkelAnimation>(&prim->_data,false);
                  anon_unknown_6::GetPrimProperty<tinyusdz::SkelAnimation>
                            ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_8b8,anim,attr_name,out_prop);
                  if ((bool)(undefined1)local_898 == true) {
                    bVar23 = true;
                    if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                               ,0x5c);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"GetProperty",0xb);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"():",3);
                    poVar14 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_610,0x799);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    local_988.dynamic = &local_978;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})",
                               "");
                    args = &(prim->_elementPath)._prim_part;
                    local_918.field_2._0_4_ = 0x6c656b53;
                    local_918.field_2._M_local_buf[4] = 'A';
                    local_918.field_2._M_local_buf[5] = 'n';
                    local_918.field_2._M_local_buf[6] = 'i';
                    local_918.field_2._M_local_buf[7] = 'm';
                    local_918.field_2._M_local_buf[8] = 'a';
                    local_918.field_2._M_local_buf[9] = 't';
                    local_918.field_2._M_local_buf[10] = 'i';
                    local_918.field_2._11_2_ = 0x6e6f;
                    local_918._M_string_length = 0xd;
                    local_918.field_2._M_local_buf[0xd] = '\0';
                    goto LAB_003473bd;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                             ,0x5c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"GetProperty",0xb);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3)
                  ;
                  iVar6 = 0x799;
                }
                else {
                  skel = tinyusdz::value::Value::as<tinyusdz::Skeleton>(&prim->_data,false);
                  anon_unknown_6::GetPrimProperty<tinyusdz::Skeleton>
                            ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_8b8,skel,attr_name,out_prop);
                  if ((bool)(undefined1)local_898 == true) {
                    bVar23 = true;
                    if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                               ,0x5c);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"GetProperty",0xb);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,"():",3);
                    poVar14 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_610,0x798);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    local_988.dynamic = &local_978;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})",
                               "");
                    uVar13 = 0x6e6f74656c656b53;
                    goto LAB_00346c23;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                             ,0x5c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"GetProperty",0xb);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3)
                  ;
                  iVar6 = 0x798;
                }
                goto LAB_00349590;
              }
              blendshape = tinyusdz::value::Value::as<tinyusdz::BlendShape>(&prim->_data,false);
              anon_unknown_6::GetPrimProperty<tinyusdz::BlendShape>
                        ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_8b8,blendshape,attr_name,out_prop);
              if ((bool)(undefined1)local_898 != true) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                           ,0x5c);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,"GetProperty",0xb);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
                iVar6 = 0x797;
                goto LAB_00349590;
              }
              bVar23 = true;
              if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                         ,0x5c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,"GetProperty",0xb);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
              poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x797);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
              local_988.dynamic = &local_978;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
              args = &(prim->_elementPath)._prim_part;
              local_918.field_2._0_4_ = 0x6e656c42;
              local_918.field_2._M_local_buf[4] = 'd';
              local_918.field_2._M_local_buf[5] = 'S';
              local_918.field_2._M_local_buf[6] = 'h';
              local_918.field_2._M_local_buf[7] = 'a';
              local_918.field_2._M_local_buf[8] = 'p';
              local_918.field_2._M_local_buf[9] = 'e';
              goto LAB_00349502;
            }
            skelroot = tinyusdz::value::Value::as<tinyusdz::SkelRoot>(&prim->_data,false);
            anon_unknown_6::GetPrimProperty<tinyusdz::SkelRoot>
                      ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_8b8,skelroot,attr_name,out_prop);
            if ((bool)(undefined1)local_898 == true) {
              bVar23 = true;
              if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                         ,0x5c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,"GetProperty",0xb);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
              poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x796);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
              local_988.dynamic = &local_978;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
              uVar13 = 0x746f6f526c656b53;
              goto LAB_00346c23;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,"GetProperty",0xb);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
            iVar6 = 0x796;
          }
          else {
            material = tinyusdz::value::Value::as<tinyusdz::Material>(&prim->_data,false);
            anon_unknown_6::GetPrimProperty<tinyusdz::Material>
                      ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_8b8,material,attr_name,out_prop);
            if ((bool)(undefined1)local_898 == true) {
              bVar23 = true;
              if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                         ,0x5c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,"GetProperty",0xb);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
              poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x795);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
              local_988.dynamic = &local_978;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
              uVar13 = 0x6c6169726574614d;
LAB_00346c23:
              args = &(prim->_elementPath)._prim_part;
              local_918.field_2._0_4_ = (undefined4)uVar13;
              local_918.field_2._M_local_buf[4] = (char)((ulong)uVar13 >> 0x20);
              local_918.field_2._M_local_buf[5] = (char)((ulong)uVar13 >> 0x28);
              local_918.field_2._M_local_buf[6] = (char)((ulong)uVar13 >> 0x30);
              local_918.field_2._M_local_buf[7] = (char)((ulong)uVar13 >> 0x38);
              local_918._M_string_length = 8;
              local_918.field_2._M_local_buf[8] = '\0';
              goto LAB_003473bd;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,"GetProperty",0xb);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
            iVar6 = 0x795;
          }
        }
        else {
          shader = tinyusdz::value::Value::as<tinyusdz::Shader>(&prim->_data,false);
          anon_unknown_6::GetPrimProperty<tinyusdz::Shader>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_8b8,shader,attr_name,out_prop);
          if ((bool)(undefined1)local_898 == true) {
            bVar23 = true;
            if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,"GetProperty",0xb);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
            poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x794);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            local_988.dynamic = &local_978;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
            args = &(prim->_elementPath)._prim_part;
            local_918.field_2._0_4_ = 0x64616853;
            local_918.field_2._M_local_buf[4] = 'e';
            local_918.field_2._M_local_buf[5] = 'r';
            local_918._M_string_length = 6;
            local_918.field_2._M_local_buf[6] = '\0';
            goto LAB_003473bd;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,"GetProperty",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
          iVar6 = 0x794;
        }
      }
      else {
        pGVar9 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(&prim->_data,false);
        if (out_prop == (Property *)0x0) {
          local_610 = (undefined1  [8])0x439af1;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_8b8,(unexpected_type<const_char_*> *)local_610);
        }
        else {
          local_8d8.dynamic = local_8c8;
          local_8d8._8_8_ = 0;
          local_8c8._0_8_ = local_8c8._0_8_ & 0xffffffffffffff00;
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                      (&pGVar9->indices,out_prop,err_02);
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          local_8f8 = attr_name;
          local_8f0 = prim;
          if (iVar6 == 0) {
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_8b8._8_8_ = (pointer)0x0;
            local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_894 = false;
            local_890._8_8_ = 0;
            local_880._M_local_buf[0] = '\0';
            local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_870.dynamic = (void *)0x0;
            local_858 = false;
            local_850._0_8_ = (pointer)0x0;
            local_850[8] = 0;
            local_850._9_7_ = 0;
            local_850[0x10] = 0;
            local_850._17_8_ = 0;
            auStack_818._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            auStack_818[8] = false;
            auStack_818._12_4_ = (storage_t<unsigned_int>)0x0;
            auStack_818[0x10] = false;
            auStack_818[0x11] = (storage_t<bool>)0x0;
            auStack_818[0x18] = false;
            local_788 = (storage_t<double>)0x0;
            local_780 = false;
            local_678._16_8_ = 0;
            local_678._24_8_ = 0;
            local_678.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_678._8_8_ = 0;
            local_650[0]._M_left = local_650;
            local_650[0]._M_color = _S_red;
            local_650[0]._M_parent = (_Base_ptr)0x0;
            auStack_818._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_818._40_8_ = 0;
            auStack_818._48_8_ = 0;
            auStack_818._56_8_ = 0;
            auStack_818._64_8_ = 0;
            auStack_818._72_8_ = 0;
            auStack_818[0x50] = false;
            local_7c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_7c0._8_8_ = 0;
            local_7c0._16_8_ = 0;
            local_7c0._24_8_ = 0;
            local_7c0._32_8_ = 0;
            local_7c0._40_8_ = 0;
            local_790 = false;
            local_778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_778._8_8_ = 0;
            local_778._16_8_ = 0;
            local_778._24_8_ = 0;
            local_758 = false;
            local_750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_750._8_8_ = 0;
            local_750._16_8_ = 0;
            local_750._24_8_ = 0;
            local_730 = false;
            local_708 = false;
            local_728._16_8_ = 0;
            local_728._24_8_ = 0;
            local_728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_728._8_8_ = 0;
            local_6d0 = false;
            local_700._32_8_ = 0;
            local_700._40_8_ = 0;
            local_700._16_8_ = 0;
            local_700._24_8_ = 0;
            local_700.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_700._8_8_ = 0;
            local_6a8 = false;
            local_6c8._16_8_ = 0;
            local_6c8._24_8_ = 0;
            local_6c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_6c8._8_8_ = 0;
            local_680 = false;
            local_6a0._16_8_ = 0;
            local_6a0._24_8_ = 0;
            local_6a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_6a0._8_8_ = 0;
            local_830[0x10] = 0;
            stack0xfffffffffffff7e1 = 0;
            local_830._0_8_ = (pointer)0x0;
            local_830[8] = 0;
            local_830._9_7_ = 0;
            local_650[1]._0_8_ = 0;
            local_650[1]._M_parent = (_Base_ptr)0x0;
            local_650[1]._M_left = (_Base_ptr)0x0;
            local_650[1]._M_right = (_Base_ptr)0x0;
            local_898 = Uniform;
            local_600._M_allocated_capacity._0_6_ = 0x6e656b6f74;
            local_608 = (undefined1  [8])0x5;
            local_960 = pGVar9;
            local_890._M_allocated_capacity = (size_type)&local_880;
            local_650[0]._M_right = local_650[0]._M_left;
            local_610 = (undefined1  [8])&local_600;
            ::std::__cxx11::string::_M_assign((string *)local_890._M_local_buf);
            v = extraout_EDX;
            if (local_610 != (undefined1  [8])&local_600) {
              operator_delete((void *)local_610,local_600._M_allocated_capacity + 1);
              v = extraout_EDX_00;
            }
            pGVar9 = local_960;
            if ((local_960->elementType)._blocked == true) {
              local_858 = true;
            }
            if ((local_960->elementType)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (local_960->elementType)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                         &(local_960->elementType)._paths);
              v = extraout_EDX_01;
            }
            local_600._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_610 = (undefined1  [8])0x0;
            local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
            local_5f0 = (undefined1  [8])0x0;
            auStack_5e8[0] = (string)0x0;
            auStack_5e8._1_7_ = 0;
            auStack_5e8[8] = 0;
            auStack_5e8._9_7_ = 0;
            auStack_5e8[0x10] = '\0';
            tinyusdz::to_string_abi_cxx11_
                      ((string *)&local_988,
                       (tinyusdz *)
                       (ulong)(uint)(&(pGVar9->elementType)._attrib)
                                    [(pGVar9->elementType)._attrib.has_value_ ^ 1].contained,v);
            local_958._8_8_ = (pointer)0x0;
            local_948._0_8_ = local_948._0_8_ & 0xffffffffffffff00;
            local_958._0_8_ = (pointer)local_948;
            ::std::__cxx11::string::_M_assign((string *)local_958);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988.dynamic != &local_978) {
              operator_delete(local_988.dynamic,
                              CONCAT71(local_978._M_allocated_capacity._1_7_,
                                       local_978._M_local_buf[0]) + 1);
            }
            local_978._M_local_buf[0] = -0x10;
            local_978._M_allocated_capacity._1_7_ = 0x4b64;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(0x20);
            paVar12->_M_allocated_capacity = (size_type)(paVar12->_M_local_buf + 0x10);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)paVar12,local_958._0_8_,
                       (undefined1 *)(local_958._8_8_ + local_958._0_8_));
            local_988.dynamic = paVar12;
            linb::any::operator=((any *)local_610,(any *)&local_988);
            if (CONCAT71(local_978._M_allocated_capacity._1_7_,local_978._M_local_buf[0]) != 0) {
              (**(code **)(CONCAT71(local_978._M_allocated_capacity._1_7_,local_978._M_local_buf[0])
                          + 0x20))(&local_988);
              local_978._M_local_buf[0] = '\0';
              local_978._M_allocated_capacity._1_7_ = 0;
            }
            local_8e8 = err;
            if ((pointer)local_958._0_8_ != (pointer)local_948) {
              operator_delete((void *)local_958._0_8_,(ulong)(local_948._0_8_ + 1));
            }
            pTVar1 = &local_960->elementType;
            Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_610);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_5f0);
            if ((undefined **)local_600._M_allocated_capacity != (undefined **)0x0) {
              (**(code **)(local_600._M_allocated_capacity + 0x20))((storage_union *)local_610);
              local_600._M_allocated_capacity = 0;
            }
            local_8e0 = (GeomMesh *)(local_830 + 0x18);
            AttrMetas::operator=((AttrMetas *)local_8e0,&pTVar1->_metas);
            Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
            ::std::__cxx11::string::operator=((string *)out_prop,(string *)local_610);
            (out_prop->_attrib)._variability = local_5f0._0_4_;
            (out_prop->_attrib)._varying_authored = (bool)local_5f0[4];
            ::std::__cxx11::string::operator=
                      ((string *)&(out_prop->_attrib)._type_name,(string *)auStack_5e8);
            linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
            (out_prop->_attrib)._var._blocked = (bool)local_5b0;
            local_958._0_8_ =
                 (out_prop->_attrib)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_958._8_8_ =
                 (out_prop->_attrib)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_948._0_8_ =
                 (out_prop->_attrib)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (out_prop->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5a8._0_8_;
            (out_prop->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5a8._8_8_;
            (out_prop->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5a8._16_8_;
            local_5a8._0_8_ = (pointer)0x0;
            local_5a8._8_8_ = (pointer)0x0;
            local_5a8._16_8_ = (pointer)0x0;
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_958);
            (out_prop->_attrib)._var._ts._dirty = (bool)local_5a8[0x18];
            local_958._0_8_ =
                 (out_prop->_attrib)._paths.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_958._8_8_ =
                 (out_prop->_attrib)._paths.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_948._0_8_ =
                 (out_prop->_attrib)._paths.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            (out_prop->_attrib)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (out_prop->_attrib)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (out_prop->_attrib)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_958);
            AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
            out_prop->_listOpQual = local_368;
            out_prop->_type = uStack_364;
            (out_prop->_rel).type = local_360;
            Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
            local_958._0_8_ =
                 (out_prop->_rel).targetPathVector.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_958._8_8_ =
                 (out_prop->_rel).targetPathVector.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_948._0_8_ =
                 (out_prop->_rel).targetPathVector.
                 super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            (out_prop->_rel).targetPathVector.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (out_prop->_rel).targetPathVector.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (out_prop->_rel).targetPathVector.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_958);
            (out_prop->_rel).listOpQual = local_270;
            AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
            (out_prop->_rel)._varying_authored = (bool)local_60;
            ::std::__cxx11::string::operator=((string *)&out_prop->_prop_value_type_name,asStack_58)
            ;
            out_prop->_has_custom = (bool)asStack_58[0x20];
            Property::~Property((Property *)local_610);
            AttrMetas::~AttrMetas((AttrMetas *)local_8e0);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_850);
            if (local_860 != (vtable_type *)0x0) {
              (*local_860->destroy)(&local_870);
              local_860 = (vtable_type *)0x0;
            }
            err = local_8e8;
            prim = local_8f0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_890._M_allocated_capacity != &local_880) {
              operator_delete((void *)local_890._M_allocated_capacity,
                              CONCAT71(local_880._M_allocated_capacity._1_7_,
                                       local_880._M_local_buf[0]) + 1);
            }
            attr_name = local_8f8;
            pGVar9 = local_960;
            if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
              operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
            }
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_8b8._8_8_ = (pointer)0x0;
            local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_894 = false;
            local_890._8_8_ = 0;
            local_880._M_local_buf[0] = '\0';
            local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_870.dynamic = (void *)0x0;
            local_858 = false;
            local_850._0_8_ = (pointer)0x0;
            local_850[8] = 0;
            local_850._9_7_ = 0;
            local_850[0x10] = 0;
            local_850._17_8_ = 0;
            auStack_818._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            auStack_818[8] = false;
            auStack_818._12_4_ = (storage_t<unsigned_int>)0x0;
            auStack_818[0x10] = false;
            auStack_818[0x11] = (storage_t<bool>)0x0;
            auStack_818[0x18] = false;
            local_788 = (storage_t<double>)0x0;
            local_780 = false;
            local_678._16_8_ = 0;
            local_678._24_8_ = 0;
            local_678.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_678._8_8_ = 0;
            local_650[0]._M_left = local_650;
            local_650[0]._M_color = _S_red;
            local_650[0]._M_parent = (_Base_ptr)0x0;
            auStack_818._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_818._40_8_ = 0;
            auStack_818._48_8_ = 0;
            auStack_818._56_8_ = 0;
            auStack_818._64_8_ = 0;
            auStack_818._72_8_ = 0;
            auStack_818[0x50] = false;
            local_7c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_7c0._8_8_ = 0;
            local_7c0._16_8_ = 0;
            local_7c0._24_8_ = 0;
            local_7c0._32_8_ = 0;
            local_7c0._40_8_ = 0;
            local_790 = false;
            local_778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_778._8_8_ = 0;
            local_778._16_8_ = 0;
            local_778._24_8_ = 0;
            local_758 = false;
            local_750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_750._8_8_ = 0;
            local_750._16_8_ = 0;
            local_750._24_8_ = 0;
            local_730 = false;
            local_708 = false;
            local_728._16_8_ = 0;
            local_728._24_8_ = 0;
            local_728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_728._8_8_ = 0;
            local_6d0 = false;
            local_700._32_8_ = 0;
            local_700._40_8_ = 0;
            local_700._16_8_ = 0;
            local_700._24_8_ = 0;
            local_700.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_700._8_8_ = 0;
            local_6a8 = false;
            local_6c8._16_8_ = 0;
            local_6c8._24_8_ = 0;
            local_6c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_6c8._8_8_ = 0;
            local_680 = false;
            local_6a0._16_8_ = 0;
            local_6a0._24_8_ = 0;
            local_6a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_6a0._8_8_ = 0;
            local_830[0x10] = 0;
            stack0xfffffffffffff7e1 = 0;
            local_830._0_8_ = (pointer)0x0;
            local_830[8] = 0;
            local_830._9_7_ = 0;
            local_650[1]._0_8_ = 0;
            local_650[1]._M_parent = (_Base_ptr)0x0;
            local_650[1]._M_left = (_Base_ptr)0x0;
            local_650[1]._M_right = (_Base_ptr)0x0;
            local_898 = Uniform;
            local_600._M_allocated_capacity._0_6_ = 0x6e656b6f74;
            local_608 = (undefined1  [8])0x5;
            local_8e8 = err;
            local_890._M_allocated_capacity = (size_type)&local_880;
            local_650[0]._M_right = local_650[0]._M_left;
            local_610 = (undefined1  [8])&local_600;
            ::std::__cxx11::string::_M_assign((string *)local_890._M_local_buf);
            if (local_610 != (undefined1  [8])&local_600) {
              operator_delete((void *)local_610,local_600._M_allocated_capacity + 1);
            }
            if ((pGVar9->familyName)._blocked == true) {
              local_858 = true;
            }
            if ((pGVar9->familyName)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pGVar9->familyName)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                         &(pGVar9->familyName)._paths);
            }
            local_960 = pGVar9;
            if ((pGVar9->familyName)._attrib.has_value_ == true) {
              local_958[0] = 1;
              local_958._8_8_ = local_948 + 8;
              lVar19 = *(long *)&(pGVar9->familyName)._attrib.contained;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_958 + 8),lVar19,
                         lVar19 + *(long *)((long)&(pGVar9->familyName)._attrib.contained + 8));
              uVar18 = local_958[0];
              if ((string)local_958[0] == (string)0x1) {
                local_978._M_local_buf[0] = -0x10;
                local_978._M_allocated_capacity._1_7_ = 0x4b64;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)operator_new(0x20);
                paVar12->_M_allocated_capacity = (size_type)(paVar12->_M_local_buf + 0x10);
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)paVar12,local_958._8_8_,local_948._0_8_ + local_958._8_8_);
                local_600._M_allocated_capacity =
                     (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
                local_610 = (undefined1  [8])0x0;
                local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
                local_5f0 = (undefined1  [8])0x0;
                auStack_5e8[0] = (string)0x0;
                auStack_5e8._1_7_ = 0;
                auStack_5e8[8] = 0;
                auStack_5e8._9_7_ = 0;
                auStack_5e8[0x10] = '\0';
                local_988.dynamic = paVar12;
                linb::any::operator=((any *)local_610,(any *)&local_988);
                Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_610);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_5f0);
                if ((undefined **)local_600._M_allocated_capacity != (undefined **)0x0) {
                  (**(code **)(local_600._M_allocated_capacity + 0x20))((storage_union *)local_610);
                  local_600._M_allocated_capacity = 0;
                }
                pGVar9 = local_960;
                if (CONCAT71(local_978._M_allocated_capacity._1_7_,local_978._M_local_buf[0]) != 0)
                {
                  (**(code **)(CONCAT71(local_978._M_allocated_capacity._1_7_,
                                        local_978._M_local_buf[0]) + 0x20))(&local_988);
                  local_978._M_local_buf[0] = '\0';
                  local_978._M_allocated_capacity._1_7_ = 0;
                  pGVar9 = local_960;
                }
              }
              else {
                local_988.dynamic = &local_978;
                local_610 = (undefined1  [8])0x31;
                local_988.dynamic =
                     (void *)::std::__cxx11::string::_M_create
                                       ((ulong *)&local_988.dynamic,(ulong)local_610);
                local_978._M_local_buf[0] = local_610[0];
                local_978._M_allocated_capacity._1_7_ = local_610._1_7_;
                *(undefined8 *)local_988.dynamic = 0x616e7265746e495b;
                *(undefined8 *)((long)local_988.dynamic + 8) = 0x205d726f7272456c;
                *(undefined8 *)((long)local_988.dynamic + 0x10) = 0x2064696c61766e49;
                *(undefined8 *)((long)local_988.dynamic + 0x18) = 0x7474416465707954;
                *(undefined8 *)((long)local_988.dynamic + 0x20) = 0x7b3c657475626972;
                *(undefined8 *)((long)local_988.dynamic + 0x28) = 0x65756c6176203e7d;
                *(string *)((long)local_988.dynamic + 0x30) = (string)0x2e;
                *(string *)((long)local_988.dynamic + (long)local_610) = (string)0x0;
                local_918.field_2._0_4_ = 0x656b6f74;
                local_918.field_2._M_local_buf[4] = 'n';
                local_918.field_2._M_local_buf[5] = '\0';
                local_918._M_string_length = 5;
                local_988._8_1_ = local_978._M_local_buf[0];
                local_988._9_7_ = local_978._M_allocated_capacity._1_7_;
                local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
                fmt::format<std::__cxx11::string>
                          ((string *)local_610,(fmt *)&local_988,(string *)&local_918,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_610);
                ::std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_610);
                if (local_610 != (undefined1  [8])&local_600) {
                  operator_delete((void *)local_610,local_600._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_918._M_dataplus._M_p != &local_918.field_2) {
                  operator_delete(local_918._M_dataplus._M_p,
                                  CONCAT17(local_918.field_2._M_local_buf[7],
                                           CONCAT16(local_918.field_2._M_local_buf[6],
                                                    CONCAT15(local_918.field_2._M_local_buf[5],
                                                             CONCAT14(local_918.field_2._M_local_buf
                                                                      [4],local_918.field_2._0_4_)))
                                          ) + 1);
                }
                pGVar9 = local_960;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_988.dynamic != &local_978) {
                  operator_delete(local_988.dynamic,
                                  CONCAT71(local_978._M_allocated_capacity._1_7_,
                                           local_978._M_local_buf[0]) + 1);
                }
              }
              if (((string)local_958[0] == (string)0x1) &&
                 ((pointer)local_958._8_8_ != (pointer)(local_948 + 8))) {
                operator_delete((void *)local_958._8_8_,CONCAT71(local_948._9_7_,local_948[8]) + 1);
              }
              if ((string)uVar18 != (string)0x0) goto LAB_00348ac8;
              bVar23 = false;
            }
            else {
LAB_00348ac8:
              AttrMetas::operator=((AttrMetas *)(local_830 + 0x18),&(pGVar9->familyName)._metas);
              Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
              ::std::__cxx11::string::operator=((string *)out_prop,(string *)local_610);
              (out_prop->_attrib)._variability = local_5f0._0_4_;
              (out_prop->_attrib)._varying_authored = (bool)local_5f0[4];
              ::std::__cxx11::string::operator=
                        ((string *)&(out_prop->_attrib)._type_name,(string *)auStack_5e8);
              linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
              (out_prop->_attrib)._var._blocked = (bool)local_5b0;
              local_958._0_8_ =
                   (out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_958._8_8_ =
                   (out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_948._0_8_ =
                   (out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (out_prop->_attrib)._var._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5a8._0_8_;
              (out_prop->_attrib)._var._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5a8._8_8_;
              (out_prop->_attrib)._var._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5a8._16_8_;
              local_5a8._0_8_ = (pointer)0x0;
              local_5a8._8_8_ = (pointer)0x0;
              local_5a8._16_8_ = (pointer)0x0;
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)local_958);
              (out_prop->_attrib)._var._ts._dirty = (bool)local_5a8[0x18];
              local_958._0_8_ =
                   (out_prop->_attrib)._paths.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_958._8_8_ =
                   (out_prop->_attrib)._paths.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_948._0_8_ =
                   (out_prop->_attrib)._paths.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              (out_prop->_attrib)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              (out_prop->_attrib)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              (out_prop->_attrib)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_958);
              AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
              out_prop->_listOpQual = local_368;
              out_prop->_type = uStack_364;
              (out_prop->_rel).type = local_360;
              Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
              local_958._0_8_ =
                   (out_prop->_rel).targetPathVector.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_958._8_8_ =
                   (out_prop->_rel).targetPathVector.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_948._0_8_ =
                   (out_prop->_rel).targetPathVector.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              (out_prop->_rel).targetPathVector.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              (out_prop->_rel).targetPathVector.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              (out_prop->_rel).targetPathVector.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_958);
              (out_prop->_rel).listOpQual = local_270;
              AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
              (out_prop->_rel)._varying_authored = (bool)local_60;
              ::std::__cxx11::string::operator=
                        ((string *)&out_prop->_prop_value_type_name,asStack_58);
              out_prop->_has_custom = (bool)asStack_58[0x20];
              Property::~Property((Property *)local_610);
              bVar23 = true;
            }
            prim = local_8f0;
            AttrMetas::~AttrMetas((AttrMetas *)(local_830 + 0x18));
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_850);
            attr_name = local_8f8;
            if (local_860 != (vtable_type *)0x0) {
              (*local_860->destroy)(&local_870);
              local_860 = (vtable_type *)0x0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_890._M_allocated_capacity != &local_880) {
              operator_delete((void *)local_890._M_allocated_capacity,
                              CONCAT71(local_880._M_allocated_capacity._1_7_,
                                       local_880._M_local_buf[0]) + 1);
            }
            err = local_8e8;
            pGVar9 = local_960;
            if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
              operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
            }
            if (bVar23) goto LAB_00348deb;
            local_988.dynamic = &local_978;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_988,"Convert Property {} failed: {}\n","");
            fmt::format<char[11],std::__cxx11::string>
                      ((string *)local_958,(fmt *)&local_988,(string *)"familyName",
                       (char (*) [11])&local_8d8,in_R8);
            local_8b8._16_8_ = local_948._0_8_;
            local_8b8._8_8_ = local_958._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_958._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_948) {
              local_600._8_8_ = CONCAT71(local_948._9_7_,local_948[8]);
              local_610 = (undefined1  [8])&local_600;
            }
            else {
              local_610 = (undefined1  [8])local_958._0_8_;
            }
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_958._8_8_ = (pointer)0x0;
            local_948._0_8_ = local_948._0_8_ & 0xffffffffffffff00;
            local_898 = local_898 & 0xffffff00;
            if (local_610 == (undefined1  [8])&local_600) {
              local_8b8._24_8_ = local_600._8_8_;
            }
            else {
              local_8b8._0_8_ = local_610;
            }
            local_608 = (undefined1  [8])0x0;
            local_600._M_allocated_capacity = local_8b8._16_8_ & 0xffffffffffffff00;
            prim = local_8f0;
            local_958._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_948;
            local_610 = (undefined1  [8])&local_600;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988.dynamic != &local_978) {
              operator_delete(local_988.dynamic,
                              CONCAT71(local_978._M_allocated_capacity._1_7_,
                                       local_978._M_local_buf[0]) + 1);
              prim = local_8f0;
            }
          }
          else {
LAB_00348deb:
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              if (*(char *)&(((_Vector_impl *)
                             &(pGVar9->super_MaterialBinding).materialBinding.has_value_)->
                            super__Vector_impl_data)._M_start == '\x01') {
                Property::Property((Property *)local_610,
                                   (Relationship *)
                                   &(pGVar9->super_MaterialBinding).materialBinding.contained,false)
                ;
                ::std::__cxx11::string::operator=((string *)out_prop,(string *)local_610);
                (out_prop->_attrib)._variability = local_5f0._0_4_;
                (out_prop->_attrib)._varying_authored = (bool)local_5f0[4];
                ::std::__cxx11::string::operator=
                          ((string *)&(out_prop->_attrib)._type_name,(string *)auStack_5e8);
                linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
                (out_prop->_attrib)._var._blocked = (bool)local_5b0;
                local_8b8._0_8_ =
                     (out_prop->_attrib)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_8b8._8_8_ =
                     (out_prop->_attrib)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_8b8._16_8_ =
                     (out_prop->_attrib)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                (out_prop->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5a8._0_8_;
                (out_prop->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5a8._8_8_;
                (out_prop->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5a8._16_8_;
                local_5a8._0_8_ = (pointer)0x0;
                local_5a8._8_8_ = (pointer)0x0;
                local_5a8._16_8_ = (pointer)0x0;
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_8b8);
                (out_prop->_attrib)._var._ts._dirty = (bool)local_5a8[0x18];
                local_8b8._0_8_ =
                     (out_prop->_attrib)._paths.
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_8b8._8_8_ =
                     (out_prop->_attrib)._paths.
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_8b8._16_8_ =
                     (out_prop->_attrib)._paths.
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                (out_prop->_attrib)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                (out_prop->_attrib)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                (out_prop->_attrib)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_8b8);
                AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
                out_prop->_listOpQual = local_368;
                out_prop->_type = uStack_364;
                (out_prop->_rel).type = local_360;
                Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
                attr_name = local_8f8;
                local_8b8._0_8_ =
                     (out_prop->_rel).targetPathVector.
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_8b8._8_8_ =
                     (out_prop->_rel).targetPathVector.
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_8b8._16_8_ =
                     (out_prop->_rel).targetPathVector.
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                (out_prop->_rel).targetPathVector.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                (out_prop->_rel).targetPathVector.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                (out_prop->_rel).targetPathVector.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_8b8);
                (out_prop->_rel).listOpQual = local_270;
                AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
                (out_prop->_rel)._varying_authored = (bool)local_60;
                ::std::__cxx11::string::operator=
                          ((string *)&out_prop->_prop_value_type_name,asStack_58);
                prim = local_8f0;
                out_prop->_has_custom = (bool)asStack_58[0x20];
                Property::~Property((Property *)local_610);
                goto LAB_003491e6;
              }
              local_898 = CONCAT31(local_898._1_3_,1);
              local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
            }
            else {
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              *)&pGVar9->props,attr_name);
              local_960 = (GeomSubset *)&(pGVar9->props)._M_t._M_impl.super__Rb_tree_header;
              if ((GeomSubset *)cVar8._M_node == local_960) {
                local_898 = CONCAT31(local_898._1_3_,1);
                local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
              }
              else {
                ::std::__cxx11::string::_M_assign((string *)out_prop);
                (out_prop->_attrib)._varying_authored = (bool)cVar8._M_node[3].field_0x4;
                (out_prop->_attrib)._variability = cVar8._M_node[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
                linb::any::operator=
                          ((any *)&(out_prop->_attrib)._var,(any *)&cVar8._M_node[4]._M_parent);
                (out_prop->_attrib)._var._blocked = SUB41(cVar8._M_node[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=(&(out_prop->_attrib)._var._ts._samples,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&cVar8._M_node[5]._M_parent);
                (out_prop->_attrib)._var._ts._dirty = SUB41(cVar8._M_node[6]._M_color,0);
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(out_prop->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &cVar8._M_node[6]._M_parent);
                AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar8._M_node + 7));
                *(_Base_ptr *)&out_prop->_listOpQual = cVar8._M_node[0x17]._M_parent;
                (out_prop->_rel).type = *(Type *)&cVar8._M_node[0x17]._M_left;
                Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar8._M_node[0x17]._M_right);
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(out_prop->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &cVar8._M_node[0x1e]._M_parent);
                (out_prop->_rel).listOpQual = cVar8._M_node[0x1f]._M_color;
                AttrMetas::operator=
                          (&(out_prop->_rel)._metas,(AttrMetas *)&cVar8._M_node[0x1f]._M_parent);
                (out_prop->_rel)._varying_authored = *(bool *)&cVar8._M_node[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
                out_prop->_has_custom = *(bool *)&cVar8._M_node[0x30]._M_right;
              }
              if ((GeomSubset *)cVar8._M_node != local_960) {
LAB_003491e6:
                local_898 = CONCAT31(local_898._1_3_,1);
                local_8b8[0] = 1;
              }
            }
          }
          if ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
              local_8d8.dynamic !=
              (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
              local_8c8) {
            operator_delete(local_8d8.dynamic,(ulong)((long)(float *)local_8c8._0_8_ + 1));
          }
        }
        if ((bool)(undefined1)local_898 == true) {
          bVar23 = true;
          if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,"GetProperty",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
          poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x793);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
          local_988.dynamic = &local_978;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
          args = &(prim->_elementPath)._prim_part;
          local_918.field_2._0_4_ = 0x6d6f6547;
          local_918.field_2._M_local_buf[4] = 'S';
          local_918.field_2._M_local_buf[5] = 'u';
          local_918.field_2._M_local_buf[6] = 'b';
          local_918.field_2._M_local_buf[7] = 's';
          local_918.field_2._M_local_buf[8] = 'e';
          local_918.field_2._M_local_buf[9] = 't';
LAB_00349502:
          local_918._M_string_length = 10;
          local_918.field_2._M_local_buf[10] = '\0';
          goto LAB_003473bd;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
        iVar6 = 0x793;
      }
LAB_00349590:
      poVar14 = (ostream *)::std::ostream::operator<<(local_610,iVar6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
      if ((bool)(undefined1)local_898 == true) {
LAB_00349963:
        __assert_fail("! has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                      ,0x881,
                      "error_type &nonstd::expected_lite::expected<bool, std::basic_string<char>>::error() & [T = bool, E = std::basic_string<char>]"
                     );
      }
      poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,(char *)local_8b8._0_8_,local_8b8._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        goto LAB_0034960c;
      }
    }
    else {
      pGVar9 = (GeomSubset *)tinyusdz::value::Value::as<tinyusdz::Xform>(&prim->_data,false);
      if (out_prop == (Property *)0x0) {
        local_610 = (undefined1  [8])0x439af1;
        local_8f8 = attr_name;
        local_8f0 = prim;
        local_8e8 = err;
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>
                  ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_8b8,(unexpected_type<const_char_*> *)local_610);
      }
      else {
        local_8f8 = attr_name;
        local_8f0 = prim;
        local_8e8 = err;
        iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
        if (iVar6 == 0) {
          Xformable::xformOpOrder
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_988,
                     (Xformable *)pGVar9);
          local_918.field_2._0_4_ = 0x4b66b0;
          local_918.field_2._M_local_buf[4] = '\0';
          local_918.field_2._M_local_buf[5] = '\0';
          local_918.field_2._M_local_buf[6] = '\0';
          local_918.field_2._M_local_buf[7] = '\0';
          pPVar15 = (pointer)operator_new(0x18);
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pPVar15,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_988);
          local_948._0_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_958._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_948[8] = false;
          local_938._0_8_ = (pointer)0x0;
          local_938[8] = 0;
          local_938._9_7_ = 0;
          local_938[0x10] = 0;
          stack0xfffffffffffff6d9 = 0;
          local_918._M_dataplus._M_p = (pointer)pPVar15;
          linb::any::operator=
                    ((any *)local_958,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_988);
          local_8b8._0_8_ = local_8b8 + 0x10;
          local_8b8._8_8_ = (pointer)0x0;
          local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
          local_898 = Varying;
          local_894 = false;
          local_890._M_allocated_capacity = (size_type)&local_880;
          local_890._8_8_ = 0;
          local_880._M_local_buf[0] = '\0';
          local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_870.dynamic = (void *)0x0;
          local_858 = false;
          local_850._0_8_ = (pointer)0x0;
          local_850[8] = 0;
          local_850._9_7_ = 0;
          local_850[0x10] = 0;
          local_850._17_8_ = 0;
          local_960 = (GeomSubset *)local_830;
          auStack_818._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
          auStack_818[8] = false;
          auStack_818._12_4_ = (storage_t<unsigned_int>)0x0;
          auStack_818[0x10] = false;
          auStack_818[0x11] = (storage_t<bool>)0x0;
          auStack_818[0x18] = false;
          local_788 = (storage_t<double>)0x0;
          local_780 = false;
          local_678._16_8_ = 0;
          local_678._24_8_ = 0;
          local_678.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_678._8_8_ = 0;
          local_650[0]._M_left = local_650;
          local_650[0]._M_color = _S_red;
          local_650[0]._M_parent = (_Base_ptr)0x0;
          auStack_818._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_818._40_8_ = 0;
          auStack_818._48_8_ = 0;
          auStack_818._56_8_ = 0;
          auStack_818._64_8_ = 0;
          auStack_818._72_8_ = 0;
          auStack_818[0x50] = false;
          local_7c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_7c0._8_8_ = 0;
          local_7c0._16_8_ = 0;
          local_7c0._24_8_ = 0;
          local_7c0._32_8_ = 0;
          local_7c0._40_8_ = 0;
          local_790 = false;
          local_778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_778._8_8_ = 0;
          local_778._16_8_ = 0;
          local_778._24_8_ = 0;
          local_758 = false;
          local_750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_750._8_8_ = 0;
          local_750._16_8_ = 0;
          local_750._24_8_ = 0;
          local_730 = false;
          local_708 = false;
          local_728._16_8_ = 0;
          local_728._24_8_ = 0;
          local_728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_728._8_8_ = 0;
          local_6d0 = false;
          local_700._32_8_ = 0;
          local_700._40_8_ = 0;
          local_700._16_8_ = 0;
          local_700._24_8_ = 0;
          local_700.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_700._8_8_ = 0;
          local_6a8 = false;
          local_6c8._16_8_ = 0;
          local_6c8._24_8_ = 0;
          local_6c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_6c8._8_8_ = 0;
          local_680 = false;
          local_6a0._16_8_ = 0;
          local_6a0._24_8_ = 0;
          local_6a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_6a0._8_8_ = 0;
          local_830[0x10] = 0;
          stack0xfffffffffffff7e1 = 0;
          local_830._0_8_ = (pointer)0x0;
          local_830[8] = 0;
          local_830._9_7_ = 0;
          local_650[1]._0_8_ = 0;
          local_650[1]._M_parent = (_Base_ptr)0x0;
          local_650[1]._M_left = (_Base_ptr)0x0;
          local_650[1]._M_right = (_Base_ptr)0x0;
          local_650[0]._M_right = local_650[0]._M_left;
          Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_958);
          local_898 = Uniform;
          Property::Property((Property *)local_610);
          Property::set_attribute((Property *)local_610,(Attribute *)local_8b8);
          ::std::__cxx11::string::_M_assign((string *)out_prop);
          (out_prop->_attrib)._varying_authored = (bool)local_5f0[4];
          (out_prop->_attrib)._variability = local_5f0._0_4_;
          ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
          linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
          (out_prop->_attrib)._var._blocked = (bool)local_5b0;
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(out_prop->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_5a8);
          (out_prop->_attrib)._var._ts._dirty = (bool)local_5a8[0x18];
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(out_prop->_attrib)._paths,&local_588);
          AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
          out_prop->_listOpQual = local_368;
          out_prop->_type = uStack_364;
          (out_prop->_rel).type = local_360;
          Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(out_prop->_rel).targetPathVector,&local_288);
          (out_prop->_rel).listOpQual = local_270;
          AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
          (out_prop->_rel)._varying_authored = (bool)local_60;
          ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
          out_prop->_has_custom = (bool)asStack_58[0x20];
          Property::~Property((Property *)local_610);
          AttrMetas::~AttrMetas((AttrMetas *)(local_830 + 0x18));
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_960);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_850);
          if (local_860 != (vtable_type *)0x0) {
            (*local_860->destroy)(&local_870);
            local_860 = (vtable_type *)0x0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_890._M_allocated_capacity != &local_880) {
            operator_delete((void *)local_890._M_allocated_capacity,
                            CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
            operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
          }
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_938);
          if ((pointer)local_948._0_8_ != (pointer)0x0) {
            (*(code *)(((string *)(local_948._0_8_ + 0x20))->_M_dataplus)._M_p)(local_958);
            local_948._0_8_ = (pointer)0x0;
          }
          lVar19 = CONCAT17(local_918.field_2._M_local_buf[7],
                            CONCAT16(local_918.field_2._M_local_buf[6],
                                     CONCAT15(local_918.field_2._M_local_buf[5],
                                              CONCAT14(local_918.field_2._M_local_buf[4],
                                                       local_918.field_2._0_4_))));
          if (lVar19 != 0) {
            (**(code **)(lVar19 + 0x20))(&local_918);
            local_918.field_2._0_4_ = 0;
            local_918.field_2._M_local_buf[4] = '\0';
            local_918.field_2._M_local_buf[5] = '\0';
            local_918.field_2._M_local_buf[6] = '\0';
            local_918.field_2._M_local_buf[7] = '\0';
          }
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_988);
        }
        else {
          this = *(pointer *)&(pGVar9->super_MaterialBinding).materialBinding;
          pXVar3 = *(pointer *)&(pGVar9->super_MaterialBinding).materialBinding.contained;
          local_960 = pGVar9;
          if (this != pXVar3) {
            bVar23 = false;
            op = extraout_RDX;
            do {
              tinyusdz::to_string_abi_cxx11_((string *)&local_988,(tinyusdz *)this,op);
              if ((this->suffix)._M_string_length != 0) {
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_610,":",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&this->suffix);
                ::std::__cxx11::string::_M_append((char *)&local_988,(ulong)local_610);
                if (local_610 != (undefined1  [8])&local_600) {
                  operator_delete((void *)local_610,local_600._M_allocated_capacity + 1);
                }
              }
              op = (OpType *)CONCAT71(local_988._9_7_,local_988._8_1_);
              if ((op == (OpType *)local_8f8->_M_string_length) &&
                 ((op == (OpType *)0x0 ||
                  (iVar6 = bcmp(local_988.dynamic,(local_8f8->_M_dataplus)._M_p,(size_t)op),
                  op = extraout_RDX_00, iVar6 == 0)))) {
                local_948._0_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
                uVar18 = 0;
                local_958._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_948[8] = false;
                local_938._0_8_ = (pointer)0x0;
                local_938[8] = 0;
                local_938._9_7_ = 0;
                local_938[0x10] = 0;
                stack0xfffffffffffff6d9 = 0;
                local_8b8._0_8_ = local_8b8 + 0x10;
                local_8b8._8_8_ = (pointer)0x0;
                local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
                local_898 = Varying;
                local_894 = false;
                local_890._M_allocated_capacity = (size_type)&local_880;
                local_890._8_8_ = 0;
                local_880._M_local_buf[0] = '\0';
                local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
                local_870.dynamic = (void *)0x0;
                local_858 = false;
                local_850._0_8_ = (pointer)0x0;
                local_850[8] = 0;
                local_850._9_7_ = 0;
                local_850[0x10] = 0;
                local_850._17_8_ = 0;
                auStack_818._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                auStack_818[8] = false;
                auStack_818._12_4_ = (storage_t<unsigned_int>)0x0;
                auStack_818[0x10] = false;
                auStack_818[0x11] = (storage_t<bool>)0x0;
                auStack_818[0x18] = false;
                local_788 = (storage_t<double>)0x0;
                local_780 = false;
                local_678._16_8_ = 0;
                local_678._24_8_ = 0;
                local_678.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_678._8_8_ = 0;
                local_650[0]._M_left = local_650;
                local_650[0]._M_color = _S_red;
                local_650[0]._M_parent = (_Base_ptr)0x0;
                auStack_818._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                auStack_818._40_8_ = 0;
                auStack_818._48_8_ = 0;
                auStack_818._56_8_ = 0;
                auStack_818._64_8_ = 0;
                auStack_818._72_8_ = 0;
                auStack_818[0x50] = false;
                local_7c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_7c0._8_8_ = 0;
                local_7c0._16_8_ = 0;
                local_7c0._24_8_ = 0;
                local_7c0._32_8_ = 0;
                local_7c0._40_8_ = 0;
                local_790 = false;
                local_778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_778._8_8_ = 0;
                local_778._16_8_ = 0;
                local_778._24_8_ = 0;
                local_758 = false;
                local_750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_750._8_8_ = 0;
                local_750._16_8_ = 0;
                local_750._24_8_ = 0;
                local_730 = false;
                local_708 = false;
                local_728._16_8_ = 0;
                local_728._24_8_ = 0;
                local_728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_728._8_8_ = 0;
                local_6d0 = false;
                local_700._32_8_ = 0;
                local_700._40_8_ = 0;
                local_700._16_8_ = 0;
                local_700._24_8_ = 0;
                local_700.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_700._8_8_ = 0;
                local_6a8 = false;
                local_6c8._16_8_ = 0;
                local_6c8._24_8_ = 0;
                local_6c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_6c8._8_8_ = 0;
                local_680 = false;
                local_6a0._16_8_ = 0;
                local_6a0._24_8_ = 0;
                local_6a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_6a0._8_8_ = 0;
                local_830[0x10] = 0;
                stack0xfffffffffffff7e1 = 0;
                local_830._0_8_ = (pointer)0x0;
                local_830[8] = 0;
                local_830._9_7_ = 0;
                local_650[1]._0_8_ = 0;
                local_650[1]._M_parent = (_Base_ptr)0x0;
                local_650[1]._M_left = (_Base_ptr)0x0;
                local_650[1]._M_right = (_Base_ptr)0x0;
                local_650[0]._M_right = local_650[0]._M_left;
                if (this->op_type < ResetXformStack) {
                  linb::any::operator=((any *)local_958,(any *)&this->_var);
                  local_948[8] = (this->_var)._blocked;
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)local_938,&(this->_var)._ts._samples);
                  local_920 = (this->_var)._ts._dirty;
LAB_00346dc6:
                  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_958);
                  Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
                  ::std::__cxx11::string::operator=((string *)out_prop,(string *)local_610);
                  (out_prop->_attrib)._variability = local_5f0._0_4_;
                  (out_prop->_attrib)._varying_authored = (bool)local_5f0[4];
                  ::std::__cxx11::string::operator=
                            ((string *)&(out_prop->_attrib)._type_name,(string *)auStack_5e8);
                  linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
                  (out_prop->_attrib)._var._blocked = (bool)local_5b0;
                  local_918._M_dataplus._M_p =
                       (pointer)(out_prop->_attrib)._var._ts._samples.
                                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                  local_918._M_string_length =
                       (size_type)
                       (out_prop->_attrib)._var._ts._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  pSVar4 = (out_prop->_attrib)._var._ts._samples.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  (out_prop->_attrib)._var._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5a8._0_8_;
                  (out_prop->_attrib)._var._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5a8._8_8_;
                  (out_prop->_attrib)._var._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5a8._16_8_;
                  local_5a8._16_8_ = (pointer)0x0;
                  local_918.field_2._0_4_ = SUB84(pSVar4,0);
                  local_918.field_2._M_local_buf[4] = (char)((ulong)pSVar4 >> 0x20);
                  local_918.field_2._M_local_buf[5] = (char)((ulong)pSVar4 >> 0x28);
                  local_918.field_2._M_local_buf[6] = (char)((ulong)pSVar4 >> 0x30);
                  local_918.field_2._M_local_buf[7] = (char)((ulong)pSVar4 >> 0x38);
                  local_5a8._0_8_ = (pointer)0x0;
                  local_5a8._8_8_ = (pointer)0x0;
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&local_918);
                  (out_prop->_attrib)._var._ts._dirty = (bool)local_5a8[0x18];
                  local_918._M_dataplus._M_p =
                       (pointer)(out_prop->_attrib)._paths.
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                  local_918._M_string_length =
                       (size_type)
                       (out_prop->_attrib)._paths.
                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  pPVar15 = (out_prop->_attrib)._paths.
                            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  (out_prop->_attrib)._paths.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  (out_prop->_attrib)._paths.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  (out_prop->_attrib)._paths.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_918.field_2._0_4_ = SUB84(pPVar15,0);
                  local_918.field_2._M_local_buf[4] = (char)((ulong)pPVar15 >> 0x20);
                  local_918.field_2._M_local_buf[5] = (char)((ulong)pPVar15 >> 0x28);
                  local_918.field_2._M_local_buf[6] = (char)((ulong)pPVar15 >> 0x30);
                  local_918.field_2._M_local_buf[7] = (char)((ulong)pPVar15 >> 0x38);
                  local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_588.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_918);
                  AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
                  out_prop->_listOpQual = local_368;
                  out_prop->_type = uStack_364;
                  (out_prop->_rel).type = local_360;
                  Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
                  local_918._M_dataplus._M_p =
                       (pointer)(out_prop->_rel).targetPathVector.
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                  local_918._M_string_length =
                       (size_type)
                       (out_prop->_rel).targetPathVector.
                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  pPVar15 = (out_prop->_rel).targetPathVector.
                            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  (out_prop->_rel).targetPathVector.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  (out_prop->_rel).targetPathVector.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  (out_prop->_rel).targetPathVector.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_918.field_2._0_4_ = SUB84(pPVar15,0);
                  local_918.field_2._M_local_buf[4] = (char)((ulong)pPVar15 >> 0x20);
                  local_918.field_2._M_local_buf[5] = (char)((ulong)pPVar15 >> 0x28);
                  local_918.field_2._M_local_buf[6] = (char)((ulong)pPVar15 >> 0x30);
                  local_918.field_2._M_local_buf[7] = (char)((ulong)pPVar15 >> 0x38);
                  local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_288.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_918);
                  (out_prop->_rel).listOpQual = local_270;
                  AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
                  (out_prop->_rel)._varying_authored = (bool)local_60;
                  ::std::__cxx11::string::operator=
                            ((string *)&out_prop->_prop_value_type_name,asStack_58);
                  out_prop->_has_custom = (bool)asStack_58[0x20];
                  Property::~Property((Property *)local_610);
                  uVar18 = 1;
                }
                else if (this->op_type != ResetXformStack) goto LAB_00346dc6;
                AttrMetas::~AttrMetas((AttrMetas *)(local_830 + 0x18));
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_850);
                if (local_860 != (vtable_type *)0x0) {
                  (*local_860->destroy)(&local_870);
                  local_860 = (vtable_type *)0x0;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_890._M_allocated_capacity != &local_880) {
                  operator_delete((void *)local_890._M_allocated_capacity,
                                  CONCAT71(local_880._M_allocated_capacity._1_7_,
                                           local_880._M_local_buf[0]) + 1);
                }
                if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
                  operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
                }
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_938);
                if ((pointer)local_948._0_8_ != (pointer)0x0) {
                  (*(code *)(((string *)(local_948._0_8_ + 0x20))->_M_dataplus)._M_p)(local_958);
                  local_948._0_8_ = (pointer)0x0;
                }
                local_898 = CONCAT31(local_898._1_3_,1);
                local_8b8[0] = uVar18;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_988.dynamic != &local_978) {
                  operator_delete(local_988.dynamic,
                                  CONCAT71(local_978._M_allocated_capacity._1_7_,
                                           local_978._M_local_buf[0]) + 1);
                }
                if (!bVar23) goto LAB_00347295;
                break;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_988.dynamic != &local_978) {
                operator_delete(local_988.dynamic,
                                CONCAT71(local_978._M_allocated_capacity._1_7_,
                                         local_978._M_local_buf[0]) + 1);
                op = extraout_RDX_01;
              }
              this = this + 1;
              bVar23 = this == pXVar3;
            } while (!bVar23);
          }
          pGVar9 = local_960;
          cVar8 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          *)((long)&local_960[1].super_MaterialBinding.materialBindingPreview.
                                    contained + 0xf0),local_8f8);
          if (cVar8._M_node ==
              (_Base_ptr)
              ((long)&pGVar9[1].super_MaterialBinding.materialBindingPreview.contained + 0xf8)) {
            local_898 = CONCAT31(local_898._1_3_,1);
            local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
            goto LAB_00347295;
          }
          ::std::__cxx11::string::_M_assign((string *)out_prop);
          (out_prop->_attrib)._varying_authored = (bool)cVar8._M_node[3].field_0x4;
          (out_prop->_attrib)._variability = cVar8._M_node[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
          linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar8._M_node[4]._M_parent);
          (out_prop->_attrib)._var._blocked = SUB41(cVar8._M_node[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(out_prop->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&cVar8._M_node[5]._M_parent);
          (out_prop->_attrib)._var._ts._dirty = SUB41(cVar8._M_node[6]._M_color,0);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(out_prop->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &cVar8._M_node[6]._M_parent);
          AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar8._M_node + 7));
          *(_Base_ptr *)&out_prop->_listOpQual = cVar8._M_node[0x17]._M_parent;
          (out_prop->_rel).type = *(Type *)&cVar8._M_node[0x17]._M_left;
          Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar8._M_node[0x17]._M_right);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(out_prop->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &cVar8._M_node[0x1e]._M_parent);
          (out_prop->_rel).listOpQual = cVar8._M_node[0x1f]._M_color;
          AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar8._M_node[0x1f]._M_parent)
          ;
          (out_prop->_rel)._varying_authored = *(bool *)&cVar8._M_node[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
          out_prop->_has_custom = *(bool *)&cVar8._M_node[0x30]._M_right;
        }
        local_898 = CONCAT31(local_898._1_3_,1);
        local_8b8[0] = 1;
      }
LAB_00347295:
      err = local_8e8;
      if ((bool)(undefined1)local_898 == true) {
        bVar23 = true;
        if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
        poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x790);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
        local_988.dynamic = &local_978;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
        args = &(local_8f0->_elementPath)._prim_part;
        local_918.field_2._0_4_ = 0x726f6658;
        local_918.field_2._M_local_buf[4] = 'm';
        local_918.field_2._M_local_buf[5] = '\0';
        local_918._M_string_length = 5;
        attr_name = local_8f8;
        goto LAB_003473bd;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
      poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x790);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
      err = local_8e8;
      if ((bool)(undefined1)local_898 == true) goto LAB_00349963;
      poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,(char *)local_8b8._0_8_,local_8b8._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
LAB_0034960c:
        ::std::__cxx11::string::_M_append((char *)err,local_958._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_958._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_948) goto LAB_0034961e;
      }
    }
  }
  else {
    pMVar7 = tinyusdz::value::Value::as<tinyusdz::Model>(&prim->_data,false);
    if (out_prop == (Property *)0x0) {
      local_610 = (undefined1  [8])0x439af1;
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<const_char_*,_0>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_8b8,(unexpected_type<const_char_*> *)local_610);
    }
    else {
      cVar8 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)&pMVar7->props,attr_name);
      if ((_Rb_tree_header *)cVar8._M_node == &(pMVar7->props)._M_t._M_impl.super__Rb_tree_header) {
        local_898 = CONCAT31(local_898._1_3_,1);
        local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
      }
      else {
        ::std::__cxx11::string::_M_assign((string *)out_prop);
        (out_prop->_attrib)._varying_authored = (bool)cVar8._M_node[3].field_0x4;
        (out_prop->_attrib)._variability = cVar8._M_node[3]._M_color;
        ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
        linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar8._M_node[4]._M_parent);
        (out_prop->_attrib)._var._blocked = SUB41(cVar8._M_node[5]._M_color,0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=(&(out_prop->_attrib)._var._ts._samples,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&cVar8._M_node[5]._M_parent);
        (out_prop->_attrib)._var._ts._dirty = SUB41(cVar8._M_node[6]._M_color,0);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(out_prop->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar8._M_node[6]._M_parent);
        AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar8._M_node + 7));
        *(_Base_ptr *)&out_prop->_listOpQual = cVar8._M_node[0x17]._M_parent;
        (out_prop->_rel).type = *(Type *)&cVar8._M_node[0x17]._M_left;
        Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar8._M_node[0x17]._M_right);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(out_prop->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar8._M_node[0x1e]._M_parent);
        (out_prop->_rel).listOpQual = cVar8._M_node[0x1f]._M_color;
        AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar8._M_node[0x1f]._M_parent);
        (out_prop->_rel)._varying_authored = *(bool *)&cVar8._M_node[0x2f]._M_left;
        ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
        out_prop->_has_custom = *(bool *)&cVar8._M_node[0x30]._M_right;
        local_898 = CONCAT31(local_898._1_3_,1);
        local_8b8[0] = 1;
      }
    }
    if ((bool)(undefined1)local_898 != true) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
      iVar6 = 0x78f;
      goto LAB_00349590;
    }
    bVar23 = true;
    if ((value_type_conflict)local_8b8[0] != false) goto LAB_0034964e;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_610,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
    poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x78f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
    local_988.dynamic = &local_978;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_988,"Attribute `{}` does not exist in Prim {}({})","");
    local_918.field_2._0_4_ = 0x65646f4d;
    local_918.field_2._M_local_buf[4] = 'l';
LAB_00346a4c:
    local_918.field_2._M_local_buf[5] = '\0';
    args = &(prim->_elementPath)._prim_part;
    local_918._M_string_length = 5;
LAB_003473bd:
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((string *)local_958,(fmt *)&local_988,attr_name,args,&local_918,in_R9);
    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,(char *)local_958._0_8_,local_958._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_958._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_948) {
      operator_delete((void *)local_958._0_8_,(ulong)(local_948._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,
                      CONCAT17(local_918.field_2._M_local_buf[7],
                               CONCAT16(local_918.field_2._M_local_buf[6],
                                        CONCAT15(local_918.field_2._M_local_buf[5],
                                                 CONCAT14(local_918.field_2._M_local_buf[4],
                                                          local_918.field_2._0_4_)))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_988.dynamic != &local_978) {
      operator_delete(local_988.dynamic,
                      CONCAT71(local_978._M_allocated_capacity._1_7_,local_978._M_local_buf[0]) + 1)
      ;
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_958._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_958._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948) {
LAB_0034961e:
        operator_delete((void *)local_958._0_8_,(ulong)(local_948._0_8_ + 1));
      }
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
  ::std::ios_base::~ios_base((ios_base *)(local_5a8 + 8));
  bVar23 = false;
LAB_0034964e:
  if (((bool)(undefined1)local_898 == false) && ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10))
  {
    operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
  }
  if (!bVar23) {
    return false;
  }
  return true;
}

Assistant:

bool GetProperty(const tinyusdz::Prim &prim, const std::string &attr_name,
                 Property *out_prop, std::string *err) {
#define GET_PRIM_PROPERTY(__ty)                                         \
  if (prim.is<__ty>()) {                                                \
    auto ret = GetPrimProperty(*prim.as<__ty>(), attr_name, out_prop);  \
    if (ret) {                                                          \
      if (!ret.value()) {                                               \
        PUSH_ERROR_AND_RETURN(                                          \
            fmt::format("Attribute `{}` does not exist in Prim {}({})", \
                        attr_name, prim.element_path().prim_part(),     \
                        value::TypeTraits<__ty>::type_name()));         \
      }                                                                 \
    } else {                                                            \
      PUSH_ERROR_AND_RETURN(ret.error());                               \
    }                                                                   \
  } else

  GET_PRIM_PROPERTY(Model)
  GET_PRIM_PROPERTY(Xform)
  GET_PRIM_PROPERTY(Scope)
  GET_PRIM_PROPERTY(GeomMesh)
  GET_PRIM_PROPERTY(GeomSubset)
  GET_PRIM_PROPERTY(Shader)
  GET_PRIM_PROPERTY(Material)
  GET_PRIM_PROPERTY(SkelRoot)
  GET_PRIM_PROPERTY(BlendShape)
  GET_PRIM_PROPERTY(Skeleton)
  GET_PRIM_PROPERTY(SkelAnimation) {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY

  return true;
}